

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Quantize_x86_fma::forward(Quantize_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int elempack;
  uint _h;
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  byte bVar14;
  int q;
  long lVar15;
  ulong uVar16;
  int i;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  Mat local_c8;
  ulong local_80;
  int local_74;
  ulong local_70;
  Mat *local_68;
  ulong local_60;
  size_t local_58;
  Option *local_50;
  Quantize_x86_fma *local_48;
  long local_40;
  Mat *local_38;
  
  elempack = bottom_blob->elempack;
  iVar17 = bottom_blob->dims;
  local_80 = (ulong)(uint)bottom_blob->w;
  _h = bottom_blob->h;
  local_60 = (ulong)(uint)bottom_blob->c;
  local_58 = (size_t)elempack;
  if (iVar17 != 3) {
    local_74 = iVar17;
    if (iVar17 != 2) {
      if (iVar17 != 1) {
        return 0;
      }
      uVar9 = elempack * bottom_blob->w;
      sVar12 = 8;
      if (opt->use_packing_layout == false) {
        sVar12 = 1;
      }
      if ((uVar9 & 7) != 0) {
        sVar12 = 1;
      }
      Mat::create(top_blob,(int)uVar9 / (int)sVar12,sVar12,(int)sVar12,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        bVar19 = true;
      }
      else {
        bVar19 = (long)top_blob->c * top_blob->cstep == 0;
      }
      if (bVar19) {
        return -100;
      }
      uVar18 = (long)((ulong)(uint)((int)local_80 >> 0x1f) << 0x20 | local_80 & 0xffffffff) /
               (long)opt->num_threads;
      uVar16 = 1;
      if (1 < (int)uVar18) {
        uVar16 = uVar18 & 0xffffffff;
      }
      iVar17 = (int)uVar16;
      uVar18 = (long)((int)local_80 + iVar17 + -1) / (long)iVar17;
      local_50 = opt;
      local_48 = this;
      if (0 < (int)uVar18) {
        local_68 = &(this->super_Quantize).scale_data;
        uVar18 = uVar18 & 0xffffffff;
        local_70 = uVar16 * local_58;
        local_40 = local_70 * 4;
        lVar15 = 0;
        lVar13 = 0;
        uVar16 = local_80 & 0xffffffff;
        local_38 = top_blob;
        do {
          iVar10 = (int)uVar16;
          iVar11 = iVar10;
          if (iVar17 < iVar10) {
            iVar11 = iVar17;
          }
          quantize((float *)((long)bottom_blob->data + lVar13),
                   (char *)((long)local_38->data + lVar15),local_68,iVar11 * elempack,1);
          lVar13 = lVar13 + local_40;
          lVar15 = lVar15 + local_70;
          uVar16 = (ulong)(uint)-(iVar17 - iVar10);
          uVar18 = uVar18 - 1;
          top_blob = local_38;
        } while (uVar18 != 0);
      }
      if (bVar19) {
        return -100;
      }
      opt = local_50;
      this = local_48;
      if (local_74 == 3) goto LAB_0047cac9;
      if (local_74 != 2) {
        return 0;
      }
    }
    bVar14 = (elempack * _h & 7) == 0 & opt->use_packing_layout;
    local_68 = (Mat *)0x1;
    if (bVar14 != 0) {
      local_68 = (Mat *)0x8;
    }
    Mat::create(top_blob,(int)local_80,(int)(elempack * _h) / (int)local_68,(size_t)local_68,
                (int)local_68,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar19 = true;
    }
    else {
      bVar19 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar19) {
      return -100;
    }
    local_70 = local_70 & 0xffffffffffffff00;
    local_50 = opt;
    if ((0 < (int)_h && elempack == 4) && bVar14 == 0) {
      lVar13 = 3;
      uVar18 = 0;
      do {
        iVar17 = bottom_blob->w;
        sVar12 = bottom_blob->elemsize;
        pvVar1 = top_blob->data;
        lVar15 = (long)top_blob->w * top_blob->elemsize;
        pvVar2 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar7 = (this->super_Quantize).scale_data.refcount;
          local_c8.data = (this->super_Quantize).scale_data.data;
          piVar8 = (this->super_Quantize).scale_data.refcount;
          local_c8.refcount._0_4_ = SUB84(piVar8,0);
          local_c8.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_c8.elemsize._0_4_ = (undefined4)sVar3;
          local_c8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.dims = (this->super_Quantize).scale_data.dims;
          local_c8.w = (this->super_Quantize).scale_data.w;
          local_c8.h = (this->super_Quantize).scale_data.h;
          local_c8.d = (this->super_Quantize).scale_data.d;
          local_c8.c = (this->super_Quantize).scale_data.c;
          local_c8.cstep = (this->super_Quantize).scale_data.cstep;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
        }
        else {
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_c8.data =
               (void *)(sVar3 * (lVar13 + -3) + (long)(this->super_Quantize).scale_data.data);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = (undefined4)sVar3;
          local_c8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_c8.dims = 1;
          local_c8.w = 4;
          local_c8.h = 1;
          local_c8.d = 1;
          local_c8.c = 1;
          local_c8.cstep = 4;
        }
        quantize_pack4to1((float *)((long)iVar17 * uVar18 * sVar12 + (long)pvVar2),
                          (char *)((lVar13 + -3) * lVar15 + (long)pvVar1),
                          (char *)((lVar13 + -2) * lVar15 + (long)pvVar1),
                          (char *)((lVar13 + -1) * lVar15 + (long)pvVar1),
                          (char *)(lVar15 * lVar13 + (long)pvVar1),&local_c8,(int)local_80);
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        uVar18 = uVar18 + 1;
        lVar13 = lVar13 + 4;
      } while (_h != uVar18);
    }
    if (0 < (int)_h && elempack == (int)local_68) {
      lVar13 = 0;
      uVar18 = 0;
      do {
        iVar17 = bottom_blob->w;
        sVar12 = bottom_blob->elemsize;
        pvVar1 = bottom_blob->data;
        iVar11 = top_blob->w;
        sVar3 = top_blob->elemsize;
        pvVar2 = top_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar7 = (this->super_Quantize).scale_data.refcount;
          local_c8.data = (this->super_Quantize).scale_data.data;
          piVar8 = (this->super_Quantize).scale_data.refcount;
          local_c8.refcount._0_4_ = SUB84(piVar8,0);
          local_c8.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
          sVar4 = (this->super_Quantize).scale_data.elemsize;
          local_c8.elemsize._0_4_ = (undefined4)sVar4;
          local_c8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.dims = (this->super_Quantize).scale_data.dims;
          local_c8.w = (this->super_Quantize).scale_data.w;
          local_c8.h = (this->super_Quantize).scale_data.h;
          local_c8.d = (this->super_Quantize).scale_data.d;
          local_c8.c = (this->super_Quantize).scale_data.c;
          local_c8.cstep = (this->super_Quantize).scale_data.cstep;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
        }
        else {
          sVar4 = (this->super_Quantize).scale_data.elemsize;
          local_c8.data = (void *)(sVar4 * lVar13 + (long)(this->super_Quantize).scale_data.data);
          local_c8.elempack = (this->super_Quantize).scale_data.elempack;
          local_c8.allocator = (this->super_Quantize).scale_data.allocator;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = (undefined4)sVar4;
          local_c8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
          local_c8.w = elempack;
          local_c8.dims = 1;
          local_c8.h = 1;
          local_c8.d = 1;
          local_c8.c = 1;
          local_c8.cstep = local_58;
        }
        quantize((float *)((long)iVar17 * uVar18 * sVar12 + (long)pvVar1),
                 (char *)((long)iVar11 * uVar18 * sVar3 + (long)pvVar2),&local_c8,(int)local_80,
                 elempack);
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        uVar18 = uVar18 + 1;
        lVar13 = lVar13 + local_58;
      } while (_h != uVar18);
    }
    if ((char)local_70 != '\0') {
      return -100;
    }
    opt = local_50;
    if (local_74 != 3) {
      return 0;
    }
  }
LAB_0047cac9:
  bVar14 = (elempack * (int)local_60 & 7U) == 0 & opt->use_packing_layout;
  local_68 = (Mat *)0x1;
  if (bVar14 != 0) {
    local_68 = (Mat *)0x8;
  }
  Mat::create(top_blob,(int)local_80,_h,(elempack * (int)local_60) / (int)local_68,(size_t)local_68,
              (int)local_68,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    bVar19 = true;
  }
  else {
    bVar19 = (long)top_blob->c * top_blob->cstep == 0;
  }
  if (bVar19) {
    return -100;
  }
  local_70 = local_70 & 0xffffffffffffff00;
  if ((0 < (int)local_60 && elempack == 4) && bVar14 == 0) {
    iVar17 = _h * (int)local_80;
    lVar13 = 3;
    uVar18 = 0;
    do {
      sVar12 = bottom_blob->cstep;
      sVar3 = bottom_blob->elemsize;
      sVar4 = top_blob->cstep;
      pvVar1 = top_blob->data;
      sVar5 = top_blob->elemsize;
      pvVar2 = bottom_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar7 = (this->super_Quantize).scale_data.refcount;
        local_c8.data = (this->super_Quantize).scale_data.data;
        piVar8 = (this->super_Quantize).scale_data.refcount;
        local_c8.refcount._0_4_ = SUB84(piVar8,0);
        local_c8.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.dims = (this->super_Quantize).scale_data.dims;
        local_c8.w = (this->super_Quantize).scale_data.w;
        local_c8.h = (this->super_Quantize).scale_data.h;
        local_c8.d = (this->super_Quantize).scale_data.d;
        local_c8.c = (this->super_Quantize).scale_data.c;
        local_c8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
      }
      else {
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.data =
             (void *)(sVar6 * (lVar13 + -3) + (long)(this->super_Quantize).scale_data.data);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.dims = 1;
        local_c8.w = 4;
        local_c8.h = 1;
        local_c8.d = 1;
        local_c8.c = 1;
        local_c8.cstep = 4;
      }
      quantize_pack4to1((float *)(sVar12 * uVar18 * sVar3 + (long)pvVar2),
                        (char *)((lVar13 + -3) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)((lVar13 + -2) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)((lVar13 + -1) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)(sVar4 * lVar13 * sVar5 + (long)pvVar1),&local_c8,iVar17);
      piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar18 = uVar18 + 1;
      lVar13 = lVar13 + 4;
    } while (local_60 != uVar18);
  }
  if (0 < (int)local_60 && elempack == (int)local_68) {
    iVar17 = _h * (int)local_80;
    lVar13 = 0;
    uVar18 = 0;
    do {
      sVar12 = bottom_blob->cstep;
      sVar3 = bottom_blob->elemsize;
      pvVar1 = bottom_blob->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      pvVar2 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar7 = (this->super_Quantize).scale_data.refcount;
        local_c8.data = (this->super_Quantize).scale_data.data;
        piVar8 = (this->super_Quantize).scale_data.refcount;
        local_c8.refcount._0_4_ = SUB84(piVar8,0);
        local_c8.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.dims = (this->super_Quantize).scale_data.dims;
        local_c8.w = (this->super_Quantize).scale_data.w;
        local_c8.h = (this->super_Quantize).scale_data.h;
        local_c8.d = (this->super_Quantize).scale_data.d;
        local_c8.c = (this->super_Quantize).scale_data.c;
        local_c8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
      }
      else {
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_c8.data = (void *)(sVar6 * lVar13 + (long)(this->super_Quantize).scale_data.data);
        local_c8.elempack = (this->super_Quantize).scale_data.elempack;
        local_c8.allocator = (this->super_Quantize).scale_data.allocator;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = (undefined4)sVar6;
        local_c8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_c8.w = elempack;
        local_c8.dims = 1;
        local_c8.h = 1;
        local_c8.d = 1;
        local_c8.c = 1;
        local_c8.cstep = local_58;
      }
      quantize((float *)(sVar12 * uVar18 * sVar3 + (long)pvVar1),
               (char *)(sVar4 * uVar18 * sVar5 + (long)pvVar2),&local_c8,iVar17,elempack);
      piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar18 = uVar18 + 1;
      lVar13 = lVar13 + local_58;
    } while (local_60 != uVar18);
  }
  if ((char)local_70 == '\0') {
    return 0;
  }
  return -100;
}

Assistant:

int Quantize_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}